

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_relocate(Tree *this,substr next_arena)

{
  NodeData *pNVar1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t *psVar10;
  csubstr *pcVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  NodeData *pNVar15;
  TagDirective *pTVar16;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  csubstr s_03;
  csubstr s_04;
  csubstr s_05;
  csubstr s_06;
  substr sVar17;
  char msg [39];
  NodeScalar *local_c8;
  char local_68 [56];
  
  if (next_arena.len == 0 || next_arena.str == (char *)0x0) {
    builtin_strncpy(local_68,"check failed: (next_arena.not_empty())",0x27);
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x630b) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x630b) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_68,0x27,LVar4,(this->m_callbacks).m_user_data);
  }
  if (next_arena.len < (this->m_arena).len) {
    builtin_strncpy(local_68 + 0x10,"ext_arena.len >= m_arena.len)",0x1e);
    builtin_strncpy(local_68,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x630c) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x630c) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_68,0x2e,LVar5,(this->m_callbacks).m_user_data);
  }
  memcpy(next_arena.str,(this->m_arena).str,this->m_arena_pos);
  sVar9 = this->m_cap;
  if (sVar9 != 0) {
    pNVar1 = this->m_buf;
    lVar12 = 0;
    pNVar15 = pNVar1;
    do {
      pcVar13 = *(char **)((long)&(pNVar1->m_key).scalar.str + lVar12);
      sVar8 = *(size_t *)((long)&(pNVar1->m_key).scalar.len + lVar12);
      sVar7 = (this->m_arena).len;
      if (sVar7 == 0) {
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13))
        goto LAB_001c36d2;
        psVar10 = (size_t *)((long)&(pNVar1->m_key).tag.len + lVar12);
        pcVar13 = *(char **)((long)&(pNVar1->m_key).tag.str + lVar12);
        sVar8 = *psVar10;
LAB_001c3926:
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 == pcVar13 && pcVar2 != (char *)0x0)) {
          sVar8 = 0;
          goto LAB_001c372e;
        }
        pcVar11 = (csubstr *)((long)&(pNVar1->m_key).anchor.str + lVar12);
        pcVar13 = pcVar11->str;
        sVar8 = *(size_t *)((long)&(pNVar1->m_key).anchor.len + lVar12);
        psVar10 = (size_t *)((long)&(pNVar1->m_key).anchor.len + lVar12);
LAB_001c395d:
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13)) {
          sVar8 = 0;
          goto LAB_001c3794;
        }
        local_c8 = (NodeScalar *)((long)&(pNVar1->m_val).tag.str + lVar12);
        pcVar11 = (csubstr *)((long)&(pNVar1->m_val).scalar.str + lVar12);
        pcVar13 = pcVar11->str;
        sVar8 = *(size_t *)((long)&(pNVar1->m_val).scalar.len + lVar12);
        psVar10 = (size_t *)((long)&(pNVar1->m_val).scalar.len + lVar12);
LAB_001c399c:
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 == pcVar13 && pcVar2 != (char *)0x0)) {
          sVar8 = 0;
          goto LAB_001c3806;
        }
        pcVar13 = (local_c8->tag).str;
        psVar10 = (size_t *)((long)&(pNVar1->m_val).tag.len + lVar12);
        sVar8 = *psVar10;
LAB_001c39cf:
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13)) {
          sVar8 = 0;
          goto LAB_001c3860;
        }
        pcVar11 = (csubstr *)((long)&(pNVar1->m_val).anchor.str + lVar12);
        pcVar13 = pcVar11->str;
        sVar8 = *(size_t *)((long)&(pNVar1->m_val).anchor.len + lVar12);
        psVar10 = (size_t *)((long)&(pNVar1->m_val).anchor.len + lVar12);
LAB_001c3a06:
        if ((sVar8 == 0) &&
           (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13)) {
          sVar8 = 0;
          goto LAB_001c38c7;
        }
      }
      else {
        pcVar2 = (this->m_arena).str;
        if (pcVar13 < pcVar2 || pcVar2 + sVar7 < pcVar13 + sVar8) {
          psVar10 = (size_t *)((long)&(pNVar1->m_key).tag.len + lVar12);
          pcVar13 = *(char **)((long)&(pNVar1->m_key).tag.str + lVar12);
          sVar8 = *psVar10;
        }
        else {
LAB_001c36d2:
          s.len = sVar8;
          s.str = pcVar13;
          sVar17 = _relocated(this,s,next_arena);
          *(char **)((long)&(pNVar1->m_key).scalar.str + lVar12) = sVar17.str;
          *(size_t *)((long)&(pNVar1->m_key).scalar.len + lVar12) = sVar17.len;
          sVar7 = (this->m_arena).len;
          pcVar13 = *(char **)((long)&(pNVar1->m_key).tag.str + lVar12);
          sVar8 = *(size_t *)((long)&(pNVar1->m_key).tag.len + lVar12);
          psVar10 = &(pNVar15->m_key).tag.len;
          if (sVar7 == 0) goto LAB_001c3926;
        }
        pcVar2 = (this->m_arena).str;
        if ((pcVar13 < pcVar2) || (pcVar2 + sVar7 < pcVar13 + sVar8)) {
          pcVar11 = (csubstr *)((long)&(pNVar1->m_key).anchor.str + lVar12);
          pcVar13 = pcVar11->str;
          sVar8 = *(size_t *)((long)&(pNVar1->m_key).anchor.len + lVar12);
          psVar10 = (size_t *)((long)&(pNVar1->m_key).anchor.len + lVar12);
        }
        else {
LAB_001c372e:
          s_00.len = sVar8;
          s_00.str = pcVar13;
          sVar17 = _relocated(this,s_00,next_arena);
          *(char **)((long)&(pNVar1->m_key).tag.str + lVar12) = sVar17.str;
          *psVar10 = sVar17.len;
          sVar7 = (this->m_arena).len;
          pcVar11 = &(pNVar15->m_key).anchor;
          pcVar13 = *(char **)((long)&(pNVar1->m_key).anchor.str + lVar12);
          sVar8 = *(size_t *)((long)&(pNVar1->m_key).anchor.len + lVar12);
          psVar10 = &(pNVar15->m_key).anchor.len;
          if (sVar7 == 0) goto LAB_001c395d;
        }
        pcVar2 = (this->m_arena).str;
        if ((pcVar13 < pcVar2) || (pcVar2 + sVar7 < pcVar13 + sVar8)) {
          local_c8 = (NodeScalar *)((long)&(pNVar1->m_val).tag.str + lVar12);
          pcVar11 = (csubstr *)((long)&(pNVar1->m_val).scalar.str + lVar12);
          pcVar13 = pcVar11->str;
          sVar8 = pcVar11->len;
          psVar10 = (size_t *)((long)&(pNVar1->m_val).scalar.len + lVar12);
        }
        else {
LAB_001c3794:
          s_01.len = sVar8;
          s_01.str = pcVar13;
          sVar17 = _relocated(this,s_01,next_arena);
          pcVar11->str = sVar17.str;
          *psVar10 = sVar17.len;
          sVar7 = (this->m_arena).len;
          local_c8 = &pNVar15->m_val;
          pcVar11 = &(pNVar15->m_val).scalar;
          pcVar13 = *(char **)((long)&(pNVar1->m_val).scalar.str + lVar12);
          sVar8 = *(size_t *)((long)&(pNVar1->m_val).scalar.len + lVar12);
          psVar10 = &(pNVar15->m_val).scalar.len;
          if (sVar7 == 0) goto LAB_001c399c;
        }
        pcVar2 = (this->m_arena).str;
        if ((pcVar13 < pcVar2) || (pcVar2 + sVar7 < pcVar13 + sVar8)) {
          pcVar13 = (local_c8->tag).str;
          psVar10 = (size_t *)((long)&(pNVar1->m_val).tag.len + lVar12);
          sVar8 = *psVar10;
        }
        else {
LAB_001c3806:
          s_02.len = sVar8;
          s_02.str = pcVar13;
          sVar17 = _relocated(this,s_02,next_arena);
          pcVar11->str = sVar17.str;
          *psVar10 = sVar17.len;
          sVar7 = (this->m_arena).len;
          pcVar13 = (local_c8->tag).str;
          psVar10 = &(pNVar15->m_val).tag.len;
          sVar8 = *(size_t *)((long)&(pNVar1->m_val).tag.len + lVar12);
          if (sVar7 == 0) goto LAB_001c39cf;
        }
        pcVar2 = (this->m_arena).str;
        if ((pcVar13 < pcVar2) || (pcVar2 + sVar7 < pcVar13 + sVar8)) {
          pcVar11 = (csubstr *)((long)&(pNVar1->m_val).anchor.str + lVar12);
          pcVar13 = pcVar11->str;
          sVar8 = *(size_t *)((long)&(pNVar1->m_val).anchor.len + lVar12);
          psVar10 = (size_t *)((long)&(pNVar1->m_val).anchor.len + lVar12);
        }
        else {
LAB_001c3860:
          s_03.len = sVar8;
          s_03.str = pcVar13;
          sVar17 = _relocated(this,s_03,next_arena);
          (local_c8->tag).str = sVar17.str;
          *psVar10 = sVar17.len;
          sVar7 = (this->m_arena).len;
          pcVar11 = &(pNVar15->m_val).anchor;
          pcVar13 = *(char **)((long)&(pNVar1->m_val).anchor.str + lVar12);
          sVar8 = *(size_t *)((long)&(pNVar1->m_val).anchor.len + lVar12);
          psVar10 = &(pNVar15->m_val).anchor.len;
          if (sVar7 == 0) goto LAB_001c3a06;
        }
        pcVar2 = (this->m_arena).str;
        if ((pcVar2 <= pcVar13) && (pcVar13 + sVar8 <= pcVar2 + sVar7)) {
LAB_001c38c7:
          s_04.len = sVar8;
          s_04.str = pcVar13;
          sVar17 = _relocated(this,s_04,next_arena);
          pcVar11->str = sVar17.str;
          *psVar10 = sVar17.len;
        }
      }
      pNVar15 = pNVar15 + 1;
      lVar12 = lVar12 + 0x90;
    } while (sVar9 * 0x90 != lVar12);
  }
  pTVar16 = this->m_tag_directives;
  lVar12 = 0x60;
  lVar14 = 0;
  do {
    pcVar13 = *(char **)((long)&this->m_tag_directives[0].prefix.str + lVar14);
    sVar9 = *(size_t *)((long)&this->m_tag_directives[0].prefix.len + lVar14);
    sVar8 = (this->m_arena).len;
    if (sVar8 == 0) {
      if ((sVar9 == 0) && (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13)
         ) goto LAB_001c3a6e;
      psVar10 = (size_t *)((long)&this->m_tag_directives[0].handle.len + lVar14);
      pcVar13 = *(char **)((long)&this->m_tag_directives[0].handle.str + lVar14);
      sVar9 = *psVar10;
LAB_001c3b32:
      if ((sVar9 == 0) && (pcVar2 = (this->m_arena).str, pcVar2 != (char *)0x0 && pcVar2 == pcVar13)
         ) {
        sVar9 = 0;
        goto LAB_001c3acb;
      }
    }
    else {
      pcVar2 = (this->m_arena).str;
      if (pcVar13 < pcVar2 || pcVar2 + sVar8 < pcVar13 + sVar9) {
        psVar10 = (size_t *)((long)&this->m_tag_directives[0].handle.len + lVar14);
        pcVar13 = *(char **)((long)&this->m_tag_directives[0].handle.str + lVar14);
        sVar9 = *psVar10;
      }
      else {
LAB_001c3a6e:
        s_05.len = sVar9;
        s_05.str = pcVar13;
        sVar17 = _relocated(this,s_05,next_arena);
        *(char **)((long)&this->m_tag_directives[0].prefix.str + lVar14) = sVar17.str;
        *(size_t *)((long)&this->m_tag_directives[0].prefix.len + lVar14) = sVar17.len;
        sVar8 = (this->m_arena).len;
        pcVar13 = *(char **)((long)&this->m_tag_directives[0].handle.str + lVar14);
        sVar9 = *(size_t *)((long)&this->m_tag_directives[0].handle.len + lVar14);
        psVar10 = &(pTVar16->handle).len;
        if (sVar8 == 0) goto LAB_001c3b32;
      }
      pcVar2 = (this->m_arena).str;
      if ((pcVar2 <= pcVar13) && (pcVar13 + sVar9 <= pcVar2 + sVar8)) {
LAB_001c3acb:
        s_06.len = sVar9;
        s_06.str = pcVar13;
        sVar17 = _relocated(this,s_06,next_arena);
        *(char **)((long)&this->m_tag_directives[0].handle.str + lVar14) = sVar17.str;
        *psVar10 = sVar17.len;
      }
    }
    pTVar16 = (TagDirective *)((long)this->m_tag_directives + lVar12 + -0x38);
    lVar12 = lVar12 + 0x28;
    lVar14 = lVar14 + 0x28;
    if (lVar14 == 0xa0) {
      return;
    }
  } while( true );
}

Assistant:

void Tree::_relocate(substr next_arena)
{
    _RYML_CB_ASSERT(m_callbacks, next_arena.not_empty());
    _RYML_CB_ASSERT(m_callbacks, next_arena.len >= m_arena.len);
    memcpy(next_arena.str, m_arena.str, m_arena_pos);
    for(NodeData *C4_RESTRICT n = m_buf, *e = m_buf + m_cap; n != e; ++n)
    {
        if(in_arena(n->m_key.scalar))
            n->m_key.scalar = _relocated(n->m_key.scalar, next_arena);
        if(in_arena(n->m_key.tag))
            n->m_key.tag = _relocated(n->m_key.tag, next_arena);
        if(in_arena(n->m_key.anchor))
            n->m_key.anchor = _relocated(n->m_key.anchor, next_arena);
        if(in_arena(n->m_val.scalar))
            n->m_val.scalar = _relocated(n->m_val.scalar, next_arena);
        if(in_arena(n->m_val.tag))
            n->m_val.tag = _relocated(n->m_val.tag, next_arena);
        if(in_arena(n->m_val.anchor))
            n->m_val.anchor = _relocated(n->m_val.anchor, next_arena);
    }
    for(TagDirective &C4_RESTRICT td : m_tag_directives)
    {
        if(in_arena(td.prefix))
            td.prefix = _relocated(td.prefix, next_arena);
        if(in_arena(td.handle))
            td.handle = _relocated(td.handle, next_arena);
    }
}